

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O0

void __thiscall StringTest::StringTest(StringTest *this,int number)

{
  char local_38 [8];
  char name [32];
  int number_local;
  StringTest *this_local;
  
  name._28_4_ = number;
  TestCase::TestCase(&this->super_TestCase,"StringTest");
  (this->super_TestCase)._vptr_TestCase = (_func_int **)&PTR__StringTest_0010dce8;
  this->mTestNum = name._28_4_;
  snprintf(local_38,0x20,"StringTest%d",(ulong)(name._28_4_ + 1));
  name[0x17] = '\0';
  TestCase::SetTestName(&this->super_TestCase,local_38);
  return;
}

Assistant:

StringTest( int number ) : 
		TestCase( "StringTest" ), mTestNum( number ) 
	{
		char name[ 32 ];
		snprintf( name, 32, "StringTest%d", number + 1 );
		name[ 31 ] = '\0';
		SetTestName( name );	
	}